

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O1

InplaceStr GetFunctionContextVariableName(ExpressionContext *ctx,FunctionData *function,uint index)

{
  InplaceStr *pIVar1;
  byte bVar2;
  bool bVar3;
  InplaceStr IVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  byte *pbVar7;
  byte *pbVar8;
  size_t sVar9;
  byte *pbVar10;
  char *unaff_RBX;
  uint uVar11;
  ulong uVar12;
  InplaceStr IVar13;
  InplaceStr IVar14;
  byte local_48;
  byte local_47 [15];
  char *in_stack_ffffffffffffffc8;
  
  pIVar1 = &function->name->name;
  IVar14 = *pIVar1;
  bVar2 = *pIVar1->begin;
  if ((((char)bVar2 < 'A' && bVar2 != 0x24) ||
      ((IVar4 = *pIVar1, bVar2 - 0x5e < 0x21 &&
       (IVar4 = *pIVar1, (0x140000001U >> ((ulong)(bVar2 - 0x5e) & 0x3f) & 1) != 0)))) &&
     (IVar4.end = unaff_RBX, IVar4.begin = in_stack_ffffffffffffffc8,
     IVar13 = GetOperatorName(IVar4), IVar4 = IVar14, IVar13.begin != IVar13.end)) {
    IVar4 = IVar13;
  }
  uVar12 = (long)IVar4.end - (long)IVar4.begin;
  uVar11 = (int)uVar12 + 0x21;
  iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,(ulong)uVar11);
  IVar14.begin = (char *)CONCAT44(extraout_var,iVar5);
  *IVar14.begin = '$';
  uVar12 = uVar12 & 0xffffffff;
  memcpy(IVar14.begin + 1,IVar4.begin,uVar12);
  IVar14.begin[uVar12 + 1] = '_';
  uVar6 = NULLC::GetStringHash
                    ((function->type->super_TypeBase).name.begin,
                     (function->type->super_TypeBase).name.end);
  pbVar10 = local_47;
  local_48 = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
  if (9 < uVar6) {
    do {
      *pbVar10 = (char)(uVar6 / 10) + (char)(((ulong)uVar6 / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar10 = pbVar10 + 1;
      bVar3 = 99 < uVar6;
      uVar6 = uVar6 / 10;
    } while (bVar3);
  }
  pbVar7 = (byte *)(IVar14.begin + uVar12 + 3);
  do {
    pbVar8 = pbVar7;
    pbVar7 = pbVar10 + -1;
    pbVar10 = pbVar10 + -1;
    pbVar8[-1] = *pbVar7;
    pbVar7 = pbVar8 + 1;
  } while (pbVar10 != &local_48);
  *pbVar8 = 0x5f;
  pbVar10 = local_47;
  local_48 = (char)index + (char)(index / 10) * -10 | 0x30;
  if (9 < index) {
    do {
      *pbVar10 = (char)(index / 10) + (char)(((ulong)index / 10) * 0x1999999a >> 0x20) * -10 | 0x30;
      pbVar10 = pbVar10 + 1;
      bVar3 = 99 < index;
      index = index / 10;
    } while (bVar3);
  }
  do {
    pbVar8 = pbVar7;
    pbVar7 = pbVar10 + -1;
    pbVar10 = pbVar10 + -1;
    *pbVar8 = *pbVar7;
    pbVar7 = pbVar8 + 1;
  } while (pbVar10 != &local_48);
  pbVar7[0] = 0x5f;
  pbVar7[1] = 0x65;
  pbVar7[2] = 0x78;
  pbVar7[3] = 0x74;
  pbVar8[5] = 0;
  sVar9 = strlen(IVar14.begin);
  if (uVar11 <= sVar9) {
    __assert_fail("strlen(name) < nameLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                  ,0x1b3,
                  "InplaceStr GetFunctionContextVariableName(ExpressionContext &, FunctionData *, unsigned int)"
                 );
  }
  IVar14.end = IVar14.begin + sVar9;
  return IVar14;
}

Assistant:

InplaceStr GetFunctionContextVariableName(ExpressionContext &ctx, FunctionData *function, unsigned index)
{
	InplaceStr functionName = function->name->name;

	if((*functionName.begin <= '@' && *functionName.begin != '$') || *functionName.begin == '|' || *functionName.begin == '^' || *functionName.begin == '~')
	{
		InplaceStr operatorName = GetOperatorName(functionName);

		if(!operatorName.empty())
			functionName = operatorName;
	}

	unsigned nameLength = functionName.length() + 32 + 1;
	char *name = (char*)ctx.allocator->alloc(nameLength);

	char *pos = name;

	*pos++ = '$';

	memcpy(pos, functionName.begin, functionName.length());
	pos += functionName.length();

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, function->type->name.hash());

	*pos++ = '_';
	pos = NameWriteUnsigned(pos, index);

	strcpy(pos, "_ext");
	pos += strlen("_ext");

	*pos++ = 0;

	assert(strlen(name) < nameLength);
	return InplaceStr(name);
}